

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

CTX_PTR CreateSuccessors(CPpmd7 *p,Bool skip)

{
  CPpmd_State *pCVar1;
  Byte BVar2;
  byte bVar3;
  uint uVar4;
  CPpmd_State *pCVar5;
  Byte *pBVar6;
  bool bVar7;
  uint uVar8;
  CTX_PTR pCVar9;
  uint uVar10;
  Byte *pBVar11;
  ulong uVar12;
  CTX_PTR pCVar13;
  CPpmd_State *pCVar14;
  CPpmd_State *pCVar15;
  CTX_PTR in_R9;
  char cVar16;
  int iVar17;
  ulong uVar18;
  CPpmd_State *ps [64];
  CTX_PTR local_248;
  CPpmd_State *local_238 [65];
  
  pCVar5 = p->FoundState;
  uVar4 = *(uint *)&pCVar5->SuccessorLow;
  if (skip == 0) {
    local_238[0] = pCVar5;
  }
  uVar18 = (ulong)(skip == 0);
  pCVar13 = p->MinContext;
  do {
    uVar12 = (ulong)pCVar13->Suffix;
    local_248 = in_R9;
    if (uVar12 == 0) goto LAB_00178c59;
    pBVar6 = p->Base;
    pCVar13 = (CTX_PTR)(pBVar6 + uVar12);
    if (*(short *)(pBVar6 + uVar12) == 1) {
      pCVar14 = (CPpmd_State *)&pCVar13->SummFreq;
    }
    else {
      pCVar15 = (CPpmd_State *)(pBVar6 + ((ulong)pCVar13->Stats - 6));
      do {
        pCVar14 = pCVar15 + 1;
        pCVar1 = pCVar15 + 1;
        pCVar15 = pCVar14;
      } while ((Byte)*(CPpmd7_Context_Ref *)&pCVar1->Symbol != pCVar5->Symbol);
    }
    iVar17 = (int)uVar18;
    if (*(uint *)&pCVar14->SuccessorLow == uVar4) {
      local_238[uVar18] = pCVar14;
      cVar16 = '\0';
      uVar18 = (ulong)(iVar17 + 1);
    }
    else {
      pCVar13 = (CTX_PTR)(pBVar6 + *(uint *)&pCVar14->SuccessorLow);
      cVar16 = (iVar17 != 0) * '\x02' + '\x01';
      if (iVar17 == 0) {
        in_R9 = pCVar13;
      }
    }
  } while (cVar16 == '\0');
  local_248 = in_R9;
  if (cVar16 == '\x03') {
LAB_00178c59:
    BVar2 = p->Base[uVar4];
    if (pCVar13->NumStats == 1) {
      cVar16 = *(char *)((long)&pCVar13->SummFreq + 1);
    }
    else {
      pBVar6 = p->Base + pCVar13->Stats;
      do {
        pBVar11 = pBVar6;
        pBVar6 = pBVar11 + 6;
      } while (*pBVar11 != BVar2);
      bVar3 = pBVar11[1];
      uVar10 = ((uint)pCVar13->SummFreq - ((uint)pCVar13->NumStats + (uint)bVar3)) + 1;
      uVar8 = (uint)bVar3 * 2 - 2;
      if (uVar10 < uVar8) {
        cVar16 = (char)(((uVar8 + uVar10 * 3) - 1) / (uVar10 * 2));
      }
      else {
        cVar16 = uVar10 < (bVar3 - 1) * 5;
      }
      cVar16 = cVar16 + '\x01';
    }
    do {
      if ((int)uVar18 == 0) {
        return pCVar13;
      }
      if (p->HiUnit == p->LoUnit) {
        uVar12 = (ulong)p->FreeList[0];
        if (uVar12 != 0) {
          pCVar9 = (CTX_PTR)(p->Base + uVar12);
          p->FreeList[0] = *(CPpmd_Void_Ref *)(p->Base + uVar12);
          goto LAB_00178d2b;
        }
        bVar7 = false;
        pCVar9 = (CTX_PTR)AllocUnitsRare(p,0);
        if (pCVar9 != (CTX_PTR)0x0) goto LAB_00178d2b;
        local_248 = (CTX_PTR)0x0;
      }
      else {
        pCVar9 = (CTX_PTR)(p->HiUnit + -0xc);
        p->HiUnit = (Byte *)pCVar9;
LAB_00178d2b:
        pCVar9->NumStats = 1;
        *(Byte *)&pCVar9->SummFreq = BVar2;
        *(char *)((long)&pCVar9->SummFreq + 1) = cVar16;
        pCVar9->Stats = uVar4 + 1;
        iVar17 = *(int *)&p->Base;
        pCVar9->Suffix = (int)pCVar13 - iVar17;
        uVar18 = (ulong)((int)uVar18 - 1);
        *(int *)&local_238[uVar18]->SuccessorLow = (int)pCVar9 - iVar17;
        bVar7 = true;
        pCVar13 = pCVar9;
      }
    } while (bVar7);
  }
  return local_248;
}

Assistant:

static CTX_PTR CreateSuccessors(CPpmd7 *p, Bool skip)
{
  CPpmd_State upState;
  CTX_PTR c = p->MinContext;
  CPpmd_Byte_Ref upBranch = (CPpmd_Byte_Ref)SUCCESSOR(p->FoundState);
  CPpmd_State *ps[PPMD7_MAX_ORDER];
  unsigned numPs = 0;
  
  if (!skip)
    ps[numPs++] = p->FoundState;
  
  while (c->Suffix)
  {
    CPpmd_Void_Ref successor;
    CPpmd_State *s;
    c = SUFFIX(c);
    if (c->NumStats != 1)
    {
      for (s = STATS(c); s->Symbol != p->FoundState->Symbol; s++);
    }
    else
      s = ONE_STATE(c);
    successor = SUCCESSOR(s);
    if (successor != upBranch)
    {
      c = CTX(successor);
      if (numPs == 0)
        return c;
      break;
    }
    ps[numPs++] = s;
  }
  
  upState.Symbol = *(const Byte *)Ppmd7_GetPtr(p, upBranch);
  SetSuccessor(&upState, upBranch + 1);
  
  if (c->NumStats == 1)
    upState.Freq = ONE_STATE(c)->Freq;
  else
  {
    UInt32 cf, s0;
    CPpmd_State *s;
    for (s = STATS(c); s->Symbol != upState.Symbol; s++);
    cf = s->Freq - 1;
    s0 = c->SummFreq - c->NumStats - cf;
    upState.Freq = (Byte)(1 + ((2 * cf <= s0) ? (5 * cf > s0) : ((2 * cf + 3 * s0 - 1) / (2 * s0))));
  }

  while (numPs != 0)
  {
    /* Create Child */
    CTX_PTR c1; /* = AllocContext(p); */
    if (p->HiUnit != p->LoUnit)
      c1 = (CTX_PTR)(p->HiUnit -= UNIT_SIZE);
    else if (p->FreeList[0] != 0)
      c1 = (CTX_PTR)RemoveNode(p, 0);
    else
    {
      c1 = (CTX_PTR)AllocUnitsRare(p, 0);
      if (!c1)
        return NULL;
    }
    c1->NumStats = 1;
    *ONE_STATE(c1) = upState;
    c1->Suffix = REF(c);
    SetSuccessor(ps[--numPs], REF(c1));
    c = c1;
  }
  
  return c;
}